

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

bool __thiscall lunasvg::SVGPointList::parse(SVGPointList *this,string_view input)

{
  bool bVar1;
  Point local_30;
  Point value;
  SVGPointList *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (SVGPointList *)input._M_len;
  value = (Point)this;
  std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::clear(&this->m_values);
  stripLeadingSpaces((string_view *)&this_local);
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    Point::Point(&local_30);
    bVar1 = parseNumber<float>((string_view *)&this_local,&local_30.x);
    if (((!bVar1) || (bVar1 = skipOptionalSpacesOrComma((string_view *)&this_local), !bVar1)) ||
       (bVar1 = parseNumber<float>((string_view *)&this_local,&local_30.y), !bVar1)) break;
    std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::push_back
              (&this->m_values,&local_30);
    skipOptionalSpacesOrComma((string_view *)&this_local);
  }
  return false;
}

Assistant:

bool SVGPointList::parse(std::string_view input)
{
    m_values.clear();
    stripLeadingSpaces(input);
    while(!input.empty()) {
        Point value;
        if(!parseNumber(input, value.x)
            || !skipOptionalSpacesOrComma(input)
            || !parseNumber(input, value.y)) {
            return false;
        }

        m_values.push_back(value);
        skipOptionalSpacesOrComma(input);
    }

    return true;
}